

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Kernel * anon_unknown.dwarf_18c712::LeafKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  Kernel *pKVar4;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pKVar4 = (Kernel *)operator_new(0x60);
  pKVar4->_vptr_Kernel = (_func_int **)&PTR_process_00277b30;
  if (pbVar1 == pbVar2) {
    *(undefined1 *)&pKVar4[1]._vptr_Kernel = 1;
    pKVar4[2]._vptr_Kernel = (_func_int **)(pKVar4 + 4);
    pcVar3 = (def->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pKVar4 + 2),pcVar3,pcVar3 + def->_M_string_length);
    pKVar4[6]._vptr_Kernel = (_func_int **)0x0;
    pKVar4[7]._vptr_Kernel = (_func_int **)(pKVar4 + 9);
    pKVar4[8]._vptr_Kernel = (_func_int **)0x0;
    *(undefined1 *)&pKVar4[9]._vptr_Kernel = 0;
  }
  else {
    *(undefined1 *)&pKVar4[1]._vptr_Kernel = 0;
    pKVar4[2]._vptr_Kernel = (_func_int **)(pKVar4 + 4);
    pcVar3 = (def->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pKVar4 + 2),pcVar3,pcVar3 + def->_M_string_length);
    pKVar4[6]._vptr_Kernel = (_func_int **)0x0;
    pKVar4[7]._vptr_Kernel = (_func_int **)(pKVar4 + 9);
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pKVar4 + 7),pcVar3,pcVar3 + pbVar1->_M_string_length);
  }
  pKVar4[0xb]._vptr_Kernel = (_func_int **)0x0;
  return pKVar4;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        if (args.empty())
            return new LeafKernel(def);

        return new LeafKernel(def, args.front());
    }